

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

bool __thiscall dxil_spv::Converter::Impl::emit_execution_modes_amplification(Impl *this)

{
  Builder *this_00;
  MDOperand *pMVar1;
  MDNode *pMVar2;
  MDNode *num_threads;
  MDNode *arguments;
  MDOperand *as_state_node;
  Builder *builder;
  Impl *this_local;
  
  this_00 = SPIRVModule::get_builder(this->spirv_module);
  spv::Builder::addExtension(this_00,"SPV_EXT_mesh_shader");
  spv::Builder::addCapability(this_00,CapabilityMeshShadingEXT);
  pMVar1 = get_shader_property_tag(this->entry_point_meta,ASState);
  if (pMVar1 == (MDOperand *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    pMVar2 = LLVMBC::cast<LLVMBC::MDNode>(pMVar1);
    pMVar1 = LLVMBC::MDNode::getOperand(pMVar2,0);
    pMVar2 = LLVMBC::cast<LLVMBC::MDNode>(pMVar1);
    this_local._7_1_ = emit_execution_modes_thread_wave_properties(this,pMVar2);
  }
  return this_local._7_1_;
}

Assistant:

bool Converter::Impl::emit_execution_modes_amplification()
{
	auto &builder = spirv_module.get_builder();

	builder.addExtension("SPV_EXT_mesh_shader");
	builder.addCapability(spv::CapabilityMeshShadingEXT);

	auto *as_state_node = get_shader_property_tag(entry_point_meta, DXIL::ShaderPropertyTag::ASState);

	if (as_state_node)
	{
		auto *arguments = llvm::cast<llvm::MDNode>(*as_state_node);
		auto *num_threads = llvm::cast<llvm::MDNode>(arguments->getOperand(0));
		return emit_execution_modes_thread_wave_properties(num_threads);
	}
	else
		return false;
}